

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

void __thiscall sf::priv::WindowImplX11::processEvents(WindowImplX11 *this)

{
  int iVar1;
  XEvent nextEvent;
  XEvent event;
  int local_1a0 [14];
  ulong local_168;
  uint local_14c;
  XEvent local_e0;
  
LAB_001c9c37:
  do {
    iVar1 = XCheckIfEvent(this->m_display,&local_e0,
                          anon_unknown.dwarf_4cfb48::WindowsImplX11Impl::checkEvent,this->m_window);
    if (iVar1 == 0) {
      ClipboardImpl::processEvents();
      return;
    }
    while (local_e0.type == 3) {
      iVar1 = XCheckIfEvent(this->m_display,local_1a0,
                            anon_unknown.dwarf_4cfb48::WindowsImplX11Impl::checkEvent,this->m_window
                           );
      if (iVar1 == 0) break;
      if (((local_1a0[0] == 2) && (local_14c == local_e0.xkey.keycode)) &&
         (local_168 <= local_e0.xkey.time + 1 && local_e0.xkey.time <= local_168)) {
        if (this->m_keyRepeat != true) goto LAB_001c9c37;
        memcpy(&local_e0,local_1a0,0xc0);
        break;
      }
      processEvent(this,&local_e0);
      memcpy(&local_e0,local_1a0,0xc0);
    }
    processEvent(this,&local_e0);
  } while( true );
}

Assistant:

void WindowImplX11::processEvents()
{
    using namespace WindowsImplX11Impl;

    XEvent event;

    // Pick out the events that are interesting for this window
    while (XCheckIfEvent(m_display, &event, &checkEvent, reinterpret_cast<XPointer>(m_window)))
    {
        // This function implements a workaround to properly discard
        // repeated key events when necessary. The problem is that the
        // system's key events policy doesn't match SFML's one: X server will generate
        // both repeated KeyPress and KeyRelease events when maintaining a key down, while
        // SFML only wants repeated KeyPress events. Thus, we have to:
        // - Discard duplicated KeyRelease events when m_keyRepeat is true
        // - Discard both duplicated KeyPress and KeyRelease events when m_keyRepeat is false

        bool processThisEvent = true;

        // Detect repeated key events
        while (event.type == KeyRelease)
        {
            XEvent nextEvent;
            if (XCheckIfEvent(m_display, &nextEvent, checkEvent, reinterpret_cast<XPointer>(m_window)))
            {
                if ((nextEvent.type == KeyPress) && (nextEvent.xkey.keycode == event.xkey.keycode) &&
                    (event.xkey.time <= nextEvent.xkey.time) && (nextEvent.xkey.time <= event.xkey.time + 1))
                {
                    // This sequence of events comes from maintaining a key down
                    if (m_keyRepeat)
                    {
                        // Ignore the KeyRelease event and process the KeyPress event
                        event = nextEvent;
                        break;
                    }
                    else
                    {
                        // Ignore both events
                        processThisEvent = false;
                        break;
                    }
                }
                else
                {
                    // This sequence of events does not come from maintaining a key down,
                    // so process the KeyRelease event normally,
                    processEvent(event);
                    // but loop because the next event can be the first half
                    // of a sequence coming from maintaining a key down.
                    event = nextEvent;
                }
            }
            else
            {
                // No event after this KeyRelease event so assume it can be processed.
                break;
            }
        }

        if (processThisEvent)
        {
            processEvent(event);
        }
    }

    // Process clipboard window events
    priv::ClipboardImpl::processEvents();
}